

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

void __thiscall
cmCommandArgumentParserHelper::AllocateParserType
          (cmCommandArgumentParserHelper *this,ParserType *pt,char *str,int len)

{
  size_t sVar1;
  char *__dest;
  char *out;
  char *local_38;
  
  pt->str = (char *)0x0;
  if (len == 0) {
    sVar1 = strlen(str);
    len = (int)sVar1;
    if (len == 0) {
      return;
    }
  }
  __dest = (char *)operator_new__((long)(len + 1));
  local_38 = __dest;
  memcpy(__dest,str,(long)len);
  __dest[len] = '\0';
  pt->str = __dest;
  std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->Variables,&local_38);
  return;
}

Assistant:

void cmCommandArgumentParserHelper::AllocateParserType(
  cmCommandArgumentParserHelper::ParserType* pt, const char* str, int len)
{
  pt->str = nullptr;
  if (len == 0) {
    len = static_cast<int>(strlen(str));
  }
  if (len == 0) {
    return;
  }
  char* out = new char[len + 1];
  memcpy(out, str, len);
  out[len] = 0;
  pt->str = out;
  this->Variables.push_back(out);
}